

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdvariablebyte.h
# Opt level: O0

void __thiscall
FastPForLib::MaskedVByte::encodeArray
          (MaskedVByte *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  byte *in_RCX;
  ulong in_RDX;
  long in_RSI;
  ulong *in_R8;
  size_t storageinbytes;
  uint32_t val;
  size_t k;
  uint8_t *bout;
  uint8_t *initbout;
  ulong local_40;
  byte *local_38;
  
  local_38 = in_RCX;
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    uVar1 = *(uint *)(in_RSI + local_40 * 4);
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *local_38 = bVar2 & 0x7f;
      local_38 = local_38 + 1;
    }
    else if (uVar1 < 0x4000) {
      *local_38 = bVar2 & 0x7f | 0x80;
      local_38[1] = (byte)(uVar1 >> 7);
      local_38 = local_38 + 2;
    }
    else if (uVar1 < 0x200000) {
      *local_38 = bVar2 & 0x7f | 0x80;
      local_38[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      local_38[2] = (byte)(uVar1 >> 0xe);
      local_38 = local_38 + 3;
    }
    else if (uVar1 < 0x10000000) {
      *local_38 = bVar2 & 0x7f | 0x80;
      local_38[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      local_38[2] = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      local_38[3] = (byte)(uVar1 >> 0x15);
      local_38 = local_38 + 4;
    }
    else {
      *local_38 = bVar2 & 0x7f | 0x80;
      local_38[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      local_38[2] = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      local_38[3] = (byte)(uVar1 >> 0x15) & 0x7f | 0x80;
      local_38[4] = (byte)(uVar1 >> 0x1c);
      local_38 = local_38 + 5;
    }
  }
  while (bVar3 = needPaddingTo32Bits<unsigned_char>(local_38), bVar3) {
    *local_38 = 0xff;
    local_38 = local_38 + 1;
  }
  *in_R8 = (ulong)((long)local_38 - (long)in_RCX) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val(in[k]);
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0xFFU;
    }
    const size_t storageinbytes = bout - initbout;
    nvalue = storageinbytes / 4;
  }